

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

int secp256k1_fe_normalizes_to_zero_var(secp256k1_fe *r)

{
  int iVar1;
  secp256k1_fe *in_stack_00000038;
  
  secp256k1_fe_verify(r);
  iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(in_stack_00000038);
  return iVar1;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_normalizes_to_zero_var(const secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);

    return secp256k1_fe_impl_normalizes_to_zero_var(r);
}